

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shapeutil_visit_crossing_edge_pairs.cc
# Opt level: O3

bool s2shapeutil::VisitCrossings
               (S2ShapeIndex *index,CrossingType type,bool need_adjacent,EdgePairVisitor *visitor)

{
  Edge *p;
  double dVar1;
  double dVar2;
  uint uVar3;
  int iVar4;
  S2ShapeIndexCell *cell;
  const_reference pSVar5;
  const_reference pSVar6;
  long lVar7;
  undefined7 in_register_00000011;
  ulong uVar8;
  S2Point *p_00;
  uint64 uVar9;
  size_type i;
  size_type sVar10;
  bool bVar11;
  ShapeEdgeVector shape_edges;
  _Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false> local_480;
  undefined4 local_478;
  uint local_474;
  ulong local_470;
  S2LogMessage local_468;
  uint64 local_458;
  S2ShapeIndex *local_450;
  ulong local_448;
  size_type local_440;
  size_type local_438;
  _Any_data *local_430;
  S2EdgeCrosser local_428;
  InlinedVector<s2shapeutil::ShapeEdge,_16UL,_std::allocator<s2shapeutil::ShapeEdge>_> local_3b8;
  
  local_478 = (undefined4)CONCAT71(in_register_00000011,need_adjacent);
  local_3b8.allocator_and_tag_.tag_.size_ = (Tag)0;
  local_450 = index;
  local_430 = (_Any_data *)visitor;
  (*index->_vptr_S2ShapeIndex[6])(&local_480,index,0);
  local_474 = (uint)(type == INTERIOR);
  do {
    uVar9 = ((local_480._M_head_impl)->id_).id_;
    if (uVar9 == 0xffffffffffffffff) {
      (*(local_480._M_head_impl)->_vptr_IteratorBase[1])();
LAB_00227601:
      absl::InlinedVector<s2shapeutil::ShapeEdge,_16UL,_std::allocator<s2shapeutil::ShapeEdge>_>::
      clear(&local_3b8);
      return uVar9 == 0xffffffffffffffff;
    }
    local_458 = uVar9;
    cell = S2ShapeIndex::Iterator::cell((Iterator *)&local_480);
    absl::InlinedVector<s2shapeutil::ShapeEdge,_16UL,_std::allocator<s2shapeutil::ShapeEdge>_>::
    clear(&local_3b8);
    AppendShapeEdges(local_450,cell,&local_3b8);
    local_470 = (ulong)local_3b8.allocator_and_tag_.tag_.size_ >> 1;
    uVar3 = (uint)local_470;
    if (1 < (int)uVar3) {
      local_448 = (ulong)(uVar3 - 1);
      i = 1;
      sVar10 = 0;
      do {
        pSVar5 = absl::
                 InlinedVector<s2shapeutil::ShapeEdge,_16UL,_std::allocator<s2shapeutil::ShapeEdge>_>
                 ::operator[](&local_3b8,sVar10);
        uVar8 = i;
        if ((char)local_478 == '\0') {
          pSVar6 = absl::
                   InlinedVector<s2shapeutil::ShapeEdge,_16UL,_std::allocator<s2shapeutil::ShapeEdge>_>
                   ::operator[](&local_3b8,i);
          lVar7 = 0;
          do {
            dVar1 = *(double *)((long)(pSVar5->edge_).v1.c_ + lVar7);
            dVar2 = *(double *)((long)(pSVar6->edge_).v0.c_ + lVar7);
            if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
            bVar11 = lVar7 != 0x10;
            lVar7 = lVar7 + 8;
          } while (bVar11);
          if (((dVar1 == dVar2) && (!NAN(dVar1) && !NAN(dVar2))) &&
             (uVar8 = sVar10 + 2, (uVar3 & 0x7fffffff) <= uVar8)) break;
        }
        local_440 = sVar10;
        local_438 = i;
        S2EdgeCrosser::S2EdgeCrosser(&local_428,&(pSVar5->edge_).v0,&(pSVar5->edge_).v1);
        if ((int)uVar8 < (int)local_470) {
          sVar10 = uVar8 & 0xffffffff;
          do {
            pSVar6 = absl::
                     InlinedVector<s2shapeutil::ShapeEdge,_16UL,_std::allocator<s2shapeutil::ShapeEdge>_>
                     ::operator[](&local_3b8,sVar10);
            if ((Edge *)local_428.c_ == (Edge *)0x0) {
LAB_002274f2:
              p = &pSVar6->edge_;
              bVar11 = S2::IsUnitLength(&p->v0);
              if (!bVar11) {
                S2LogMessage::S2LogMessage
                          (&local_468,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_crosser.h"
                           ,0x102,kFatal,(ostream *)&std::cerr);
                std::__ostream_insert<char,std::char_traits<char>>
                          (local_468.stream_,"Check failed: S2::IsUnitLength(*c) ",0x23);
                goto LAB_002276a3;
              }
              local_428.c_ = &p->v0;
              local_428.acb_ =
                   s2pred::TriageSign(local_428.a_,local_428.b_,&p->v0,&local_428.a_cross_b_);
              local_428.acb_ = -local_428.acb_;
            }
            else {
              lVar7 = 0;
              do {
                dVar1 = *(double *)((long)((S2Point *)(local_428.c_)->c_)->c_ + lVar7);
                dVar2 = *(double *)((long)(pSVar6->edge_).v0.c_ + lVar7);
                if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
                bVar11 = lVar7 != 0x10;
                lVar7 = lVar7 + 8;
              } while (bVar11);
              if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) goto LAB_002274f2;
            }
            p_00 = &(pSVar6->edge_).v1;
            bVar11 = S2::IsUnitLength(p_00);
            if (!bVar11) {
              S2LogMessage::S2LogMessage
                        (&local_468,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_crosser.h"
                         ,0x108,kFatal,(ostream *)&std::cerr);
              std::__ostream_insert<char,std::char_traits<char>>
                        (local_468.stream_,"Check failed: S2::IsUnitLength(*d) ",0x23);
LAB_002276a3:
              abort();
            }
            iVar4 = s2pred::TriageSign(local_428.a_,local_428.b_,p_00,&local_428.a_cross_b_);
            if (((iVar4 == 0) || (local_428.acb_ != -iVar4)) &&
               (local_428.bda_ = iVar4, iVar4 = S2EdgeCrosser::CrossingSignInternal(&local_428,p_00)
               , p_00 = local_428.c_, (int)local_474 <= iVar4)) {
              local_468.severity_._0_1_ = iVar4 == 1;
              if (*(long *)(local_430 + 1) == 0) {
                std::__throw_bad_function_call();
              }
              bVar11 = (**(code **)((long)local_430 + 0x18))
                                 (local_430,pSVar5,pSVar6,(bool *)&local_468);
              p_00 = local_428.c_;
              if (!bVar11) {
                uVar9 = local_458;
                if (local_480._M_head_impl != (IteratorBase *)0x0) {
                  (*(local_480._M_head_impl)->_vptr_IteratorBase[1])();
                  uVar9 = local_458;
                }
                goto LAB_00227601;
              }
            }
            local_428.c_ = p_00;
            sVar10 = sVar10 + 1;
          } while (sVar10 != (uVar3 & 0x7fffffff));
        }
        i = local_438 + 1;
        sVar10 = local_440 + 1;
      } while (sVar10 != local_448);
    }
    (*(local_480._M_head_impl)->_vptr_IteratorBase[4])();
  } while( true );
}

Assistant:

static bool VisitCrossings(
    const S2ShapeIndex& index, CrossingType type, bool need_adjacent,
    const EdgePairVisitor& visitor) {
  // TODO(ericv): Use brute force if the total number of edges is small enough
  // (using a larger threshold if the S2ShapeIndex is not constructed yet).
  ShapeEdgeVector shape_edges;
  for (S2ShapeIndex::Iterator it(&index, S2ShapeIndex::BEGIN);
       !it.done(); it.Next()) {
    GetShapeEdges(index, it.cell(), &shape_edges);
    if (!VisitCrossings(shape_edges, type, need_adjacent, visitor)) {
      return false;
    }
  }
  return true;
}